

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

Type * slang::ast::EnumType::findDefinition
                 (Compilation *comp,EnumTypeSyntax *syntax,ASTContext *context)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  VariableDimensionSyntax *syntax_00;
  bool bVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  Symbol *pSVar4;
  Type *pTVar5;
  int32_t in_R8D;
  SourceRange range;
  string_view sVar6;
  string_view sVar7;
  EvaluatedDimension dim;
  EvaluatedDimension local_50;
  
  if ((syntax->members).elements._M_extent._M_extent_value == 0) {
    sVar7 = (string_view)ZEXT816(0);
  }
  else {
    ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                         (syntax->members).elements._M_ptr);
    pSVar1 = *ppSVar3;
    if (pSVar1[3].previewNode == (SyntaxNode *)0x0) {
      sVar7 = parsing::Token::valueText((Token *)(pSVar1 + 1));
    }
    else {
      syntax_00 = *(VariableDimensionSyntax **)pSVar1[3].parent;
      ASTContext::evalUnpackedDimension(&local_50,context,syntax_00);
      sVar7 = (string_view)ZEXT816(0);
      if (local_50.kind - Range < 2) {
        range = slang::syntax::SyntaxNode::sourceRange(&syntax_00->super_SyntaxNode);
        bVar2 = ASTContext::requirePositive
                          (context,(optional<int>)((ulong)(uint)local_50.range.left | 0x100000000),
                           range);
        sVar7 = (string_view)ZEXT816(0);
        if (bVar2) {
          bVar2 = ASTContext::requirePositive
                            (context,(optional<int>)
                                     ((ulong)(uint)local_50.range.right | 0x100000000),range);
          sVar7 = (string_view)ZEXT816(0);
          if (bVar2) {
            sVar6 = parsing::Token::valueText((Token *)(pSVar1 + 1));
            sVar7._M_len = sVar6._M_str;
            if (local_50.range.right < local_50.range.left) {
              local_50.range.left = local_50.range.right;
            }
            sVar7._M_str._0_4_ = local_50.range.left;
            sVar7._M_str._4_4_ = 0;
            sVar7 = getEnumValueName((ast *)comp,(Compilation *)sVar6._M_len,sVar7,in_R8D);
          }
        }
      }
    }
  }
  pSVar4 = Scope::find((context->scope).ptr,sVar7);
  if ((pSVar4 != (Symbol *)0x0) && (pSVar4->kind == EnumValue)) {
    pTVar5 = DeclaredType::getType((DeclaredType *)(pSVar4 + 1));
    if (pTVar5->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar5);
    }
    if ((EnumTypeSyntax *)(pTVar5->canonical->super_Symbol).originatingSyntax == syntax) {
      pTVar5 = anon_unknown.dwarf_17aeba0::createPackedDims
                         (context,pTVar5->canonical,&syntax->dimensions);
      return pTVar5;
    }
  }
  return comp->errorType;
}

Assistant:

const Type& EnumType::findDefinition(Compilation& comp, const EnumTypeSyntax& syntax,
                                     const ASTContext& context) {
    // The enum type and all of its values should have already been created and
    // added to the parent scope. We just need to find it so we can hook up our caller.
    // To do that we're going to try to look up our first member, which should have
    // the right type. If we don't find it we know an error must have occurred during
    // type creation.
    std::string_view name;
    if (!syntax.members.empty()) {
        auto member = *syntax.members.begin();
        if (member->dimensions.empty())
            name = member->name.valueText();
        else {
            auto dimList = member->dimensions[0];
            auto dim = context.evalUnpackedDimension(*dimList);
            if (dim.isRange()) {
                SourceRange dimRange = dimList->sourceRange();
                if (context.requirePositive(std::optional(dim.range.left), dimRange) &&
                    context.requirePositive(std::optional(dim.range.right), dimRange)) {
                    name = getEnumValueName(comp, member->name.valueText(), dim.range.lower());
                }
            }
        }
    }

    auto symbol = context.scope->find(name);
    if (symbol && symbol->kind == SymbolKind::EnumValue) {
        auto& type = symbol->as<EnumValueSymbol>().getType().getCanonicalType();
        if (type.getSyntax() == &syntax)
            return createPackedDims(context, &type, syntax.dimensions);
    }

    return comp.getErrorType();
}